

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O0

void __thiscall Debugger::IOWindow::Tick(IOWindow *this)

{
  Emulator *pEVar1;
  BitArg args;
  BitArg args_00;
  BitArg args_01;
  BitArg args_02;
  BitArg args_03;
  BitArg args_04;
  BitArg args_1;
  BitArg args_05;
  BitArg args_06;
  BitArg args_07;
  BitArg args_1_00;
  BitArg args_1_01;
  BitArg args_1_02;
  BitArg args_1_03;
  BitArg args_1_04;
  BitArg args_2;
  BitArg args_1_05;
  BitArg args_2_00;
  BitArg args_2_01;
  BitArg args_2_02;
  BitArg args_2_03;
  BitArg args_2_04;
  BitArg args_3;
  BitArg args_3_00;
  BitArg args_3_01;
  BitArg args_3_02;
  BitArg args_3_03;
  BitArg args_4;
  BitArg args_4_00;
  BitArg args_4_01;
  BitArg args_4_02;
  BitArg args_4_03;
  BitArg args_5;
  BitArg args_5_00;
  BitArg args_6;
  BitArg args_6_00;
  BitArg args_7;
  BitArg args_7_00;
  bool bVar2;
  SgbSwatchArg SVar3;
  SgbSwatchArg SVar4;
  SgbSwatchArg SVar5;
  SgbSwatchArg SVar6;
  DmgSwatchArg DVar7;
  char *pcVar8;
  CgbSwatchArg CVar9;
  CgbSwatchArg CVar10;
  CgbSwatchArg CVar11;
  CgbSwatchArg CVar12;
  IntArg args_08;
  IntArg args_09;
  BitArg local_6f0;
  BitArg local_6c8;
  BitArg local_6a0;
  BitArg local_678;
  BitArg local_650;
  undefined1 local_628 [16];
  IntArg local_618;
  BitArg local_608;
  IntArg local_5e0;
  BitArg local_5d0;
  BitArg local_5a8;
  BitArg local_580;
  IntArg local_558;
  IntArg local_548;
  IntArg local_538;
  undefined1 local_528 [16];
  BitArg local_518;
  BitArg local_4f0;
  DmgSwatchArg local_4c8;
  DmgSwatchArg local_4c0;
  DmgSwatchArg local_4b8;
  DmgSwatchArg local_4b0;
  DmgSwatchArg local_4a8;
  DmgSwatchArg local_4a0;
  DmgSwatchArg local_498;
  DmgSwatchArg local_490;
  DmgSwatchArg local_488;
  DmgSwatchArg local_480;
  DmgSwatchArg local_478;
  DmgSwatchArg local_470;
  IntArg local_468;
  BitArg local_458;
  BitArg local_430;
  BitArg local_408;
  BitArg local_3e0;
  BitArg local_3b8;
  BitArg local_390;
  BitArg local_368;
  BitArg local_340;
  BitArg local_318;
  BitArg local_2f0;
  BitArg local_2c8;
  BitArg local_2a0;
  BitArg local_278;
  BitArg local_250;
  BitArg local_228;
  BitArg local_200;
  BitArg local_1d8;
  BitArg local_1b0;
  u8 local_181;
  BitArg local_180;
  BitArg local_158;
  BitArg local_130;
  BitArg local_108;
  BitArg local_e0;
  BitArg local_b8;
  BitArg local_90;
  BitArg local_68;
  BitArg local_40;
  IOWindow *pIStack_10;
  u8 v;
  IOWindow *this_local;
  
  if (((this->super_Window).is_open & 1U) != 0) {
    pIStack_10 = this;
    bVar2 = ImGui::Begin("IO",&(this->super_Window).is_open,0);
    if (bVar2) {
      pEVar1 = ((this->super_Window).d)->e;
      anon_unknown.dwarf_71760::InvBit(&local_40,'\x18',"D",(char *)0x0);
      anon_unknown.dwarf_71760::InvBit(&local_68,'\x14',"U",(char *)0x0);
      anon_unknown.dwarf_71760::InvBit(&local_90,'\x12',"L",(char *)0x0);
      anon_unknown.dwarf_71760::InvBit(&local_b8,'\x11',"R",(char *)0x0);
      anon_unknown.dwarf_71760::InvBit(&local_e0,'(',"+",(char *)0x0);
      anon_unknown.dwarf_71760::InvBit(&local_108,'$',"-",(char *)0x0);
      anon_unknown.dwarf_71760::InvBit(&local_130,'\"',"B",(char *)0x0);
      anon_unknown.dwarf_71760::InvBit(&local_158,'!',"A",(char *)0x0);
      args.true_text._0_4_ = (int)local_40.true_text;
      args.mask = local_40.mask;
      args._1_7_ = local_40._1_7_;
      args.true_text._4_4_ = (int)((ulong)local_40.true_text >> 0x20);
      args.false_text = local_40.false_text;
      args.tooltip._0_4_ = (int)local_40.tooltip;
      args.tooltip._4_4_ = (int)((ulong)local_40.tooltip >> 0x20);
      args.invert = local_40.invert;
      args._33_7_ = local_40._33_7_;
      args_1_00.true_text = local_68.true_text;
      args_1_00.mask = local_68.mask;
      args_1_00._1_7_ = local_68._1_7_;
      args_1_00.false_text = local_68.false_text;
      args_1_00.tooltip = local_68.tooltip;
      args_1_00.invert = local_68.invert;
      args_1_00._33_7_ = local_68._33_7_;
      args_2_00.true_text = local_90.true_text;
      args_2_00.mask = local_90.mask;
      args_2_00._1_7_ = local_90._1_7_;
      args_2_00.false_text = local_90.false_text;
      args_2_00.tooltip = local_90.tooltip;
      args_2_00.invert = local_90.invert;
      args_2_00._33_7_ = local_90._33_7_;
      args_3.true_text = local_b8.true_text;
      args_3.mask = local_b8.mask;
      args_3._1_7_ = local_b8._1_7_;
      args_3.false_text = local_b8.false_text;
      args_3.tooltip = local_b8.tooltip;
      args_3.invert = local_b8.invert;
      args_3._33_7_ = local_b8._33_7_;
      args_4.true_text = local_e0.true_text;
      args_4.mask = local_e0.mask;
      args_4._1_7_ = local_e0._1_7_;
      args_4.false_text = local_e0.false_text;
      args_4.tooltip = local_e0.tooltip;
      args_4.invert = local_e0.invert;
      args_4._33_7_ = local_e0._33_7_;
      args_5.true_text = local_108.true_text;
      args_5.mask = local_108.mask;
      args_5._1_7_ = local_108._1_7_;
      args_5.false_text = local_108.false_text;
      args_5.tooltip = local_108.tooltip;
      args_5.invert = local_108.invert;
      args_5._33_7_ = local_108._33_7_;
      args_6.true_text = local_130.true_text;
      args_6.mask = local_130.mask;
      args_6._1_7_ = local_130._1_7_;
      args_6.false_text = local_130.false_text;
      args_6.tooltip = local_130.tooltip;
      args_6.invert = local_130.invert;
      args_6._33_7_ = local_130._33_7_;
      args_7.true_text = local_158.true_text;
      args_7.mask = local_158.mask;
      args_7._1_7_ = local_158._1_7_;
      args_7.false_text = local_158.false_text;
      args_7.tooltip = local_158.tooltip;
      args_7.invert = local_158.invert;
      args_7._33_7_ = local_158._33_7_;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (pEVar1,0xff00,"JOYP",args,args_1_00,args_2_00,args_3,args_4,args_5,args_6,args_7);
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff01,"SB");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff02,"SC");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff04,"DIV");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff05,"TIMA");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff06,"TMA");
      pEVar1 = ((this->super_Window).d)->e;
      anon_unknown.dwarf_71760::Bit(&local_180,'\x04',"on","off",(char *)0x0,false);
      local_181 = (u8)anon_unknown.dwarf_71760::Enum<TimerClock>('\x03');
      args_00.true_text._0_4_ = (int)local_180.true_text;
      args_00.mask = local_180.mask;
      args_00._1_7_ = local_180._1_7_;
      args_00.true_text._4_4_ = (int)((ulong)local_180.true_text >> 0x20);
      args_00.false_text = local_180.false_text;
      args_00.tooltip._0_4_ = (int)local_180.tooltip;
      args_00.tooltip._4_4_ = (int)((ulong)local_180.tooltip >> 0x20);
      args_00.invert = local_180.invert;
      args_00._33_7_ = local_180._33_7_;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::EnumArg<TimerClock>>
                (pEVar1,0xff07,"TAC",args_00,(EnumArg<TimerClock>)local_181);
      pEVar1 = ((this->super_Window).d)->e;
      anon_unknown.dwarf_71760::Bit0(&local_1b0,'\x10',"JOYP ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_1d8,'\b',"SERIAL ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_200,'\x04',"TIMER ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_228,'\x02',"STAT ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_250,'\x01',"VBLANK ",(char *)0x0);
      args_01.true_text._0_4_ = (int)local_1b0.true_text;
      args_01.mask = local_1b0.mask;
      args_01._1_7_ = local_1b0._1_7_;
      args_01.true_text._4_4_ = (int)((ulong)local_1b0.true_text >> 0x20);
      args_01.false_text = local_1b0.false_text;
      args_01.tooltip._0_4_ = (int)local_1b0.tooltip;
      args_01.tooltip._4_4_ = (int)((ulong)local_1b0.tooltip >> 0x20);
      args_01.invert = local_1b0.invert;
      args_01._33_7_ = local_1b0._33_7_;
      args_1_01.true_text = local_1d8.true_text;
      args_1_01.mask = local_1d8.mask;
      args_1_01._1_7_ = local_1d8._1_7_;
      args_1_01.false_text = local_1d8.false_text;
      args_1_01.tooltip = local_1d8.tooltip;
      args_1_01.invert = local_1d8.invert;
      args_1_01._33_7_ = local_1d8._33_7_;
      args_2_01.true_text = local_200.true_text;
      args_2_01.mask = local_200.mask;
      args_2_01._1_7_ = local_200._1_7_;
      args_2_01.false_text = local_200.false_text;
      args_2_01.tooltip = local_200.tooltip;
      args_2_01.invert = local_200.invert;
      args_2_01._33_7_ = local_200._33_7_;
      args_3_00.true_text = local_228.true_text;
      args_3_00.mask = local_228.mask;
      args_3_00._1_7_ = local_228._1_7_;
      args_3_00.false_text = local_228.false_text;
      args_3_00.tooltip = local_228.tooltip;
      args_3_00.invert = local_228.invert;
      args_3_00._33_7_ = local_228._33_7_;
      args_4_00.true_text = local_250.true_text;
      args_4_00.mask = local_250.mask;
      args_4_00._1_7_ = local_250._1_7_;
      args_4_00.false_text = local_250.false_text;
      args_4_00.tooltip = local_250.tooltip;
      args_4_00.invert = local_250.invert;
      args_4_00._33_7_ = local_250._33_7_;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (pEVar1,0xff0f,"IF",args_01,args_1_01,args_2_01,args_3_00,args_4_00);
      pEVar1 = ((this->super_Window).d)->e;
      anon_unknown.dwarf_71760::Bit2(&local_278,0x80,"D ","Display");
      anon_unknown.dwarf_71760::Bit2(&local_2a0,'@',"WM","Window tile map select");
      anon_unknown.dwarf_71760::Bit2(&local_2c8,' ',"Wd","Window display");
      anon_unknown.dwarf_71760::Bit2(&local_2f0,'\x10',"BD","BG tile data select");
      anon_unknown.dwarf_71760::Bit2(&local_318,'\b',"BM","BG tile map select");
      anon_unknown.dwarf_71760::Bit2(&local_340,'\x04',"Os","Obj size");
      anon_unknown.dwarf_71760::Bit2(&local_368,'\x02',"Od","Obj display");
      anon_unknown.dwarf_71760::Bit2(&local_390,'\x01',"Bd","BG display");
      args_02.true_text._0_4_ = (int)local_278.true_text;
      args_02.mask = local_278.mask;
      args_02._1_7_ = local_278._1_7_;
      args_02.true_text._4_4_ = (int)((ulong)local_278.true_text >> 0x20);
      args_02.false_text = local_278.false_text;
      args_02.tooltip._0_4_ = (int)local_278.tooltip;
      args_02.tooltip._4_4_ = (int)((ulong)local_278.tooltip >> 0x20);
      args_02.invert = local_278.invert;
      args_02._33_7_ = local_278._33_7_;
      args_1_02.true_text = local_2a0.true_text;
      args_1_02.mask = local_2a0.mask;
      args_1_02._1_7_ = local_2a0._1_7_;
      args_1_02.false_text = local_2a0.false_text;
      args_1_02.tooltip = local_2a0.tooltip;
      args_1_02.invert = local_2a0.invert;
      args_1_02._33_7_ = local_2a0._33_7_;
      args_2_02.true_text = local_2c8.true_text;
      args_2_02.mask = local_2c8.mask;
      args_2_02._1_7_ = local_2c8._1_7_;
      args_2_02.false_text = local_2c8.false_text;
      args_2_02.tooltip = local_2c8.tooltip;
      args_2_02.invert = local_2c8.invert;
      args_2_02._33_7_ = local_2c8._33_7_;
      args_3_01.true_text = local_2f0.true_text;
      args_3_01.mask = local_2f0.mask;
      args_3_01._1_7_ = local_2f0._1_7_;
      args_3_01.false_text = local_2f0.false_text;
      args_3_01.tooltip = local_2f0.tooltip;
      args_3_01.invert = local_2f0.invert;
      args_3_01._33_7_ = local_2f0._33_7_;
      args_4_01.true_text = local_318.true_text;
      args_4_01.mask = local_318.mask;
      args_4_01._1_7_ = local_318._1_7_;
      args_4_01.false_text = local_318.false_text;
      args_4_01.tooltip = local_318.tooltip;
      args_4_01.invert = local_318.invert;
      args_4_01._33_7_ = local_318._33_7_;
      args_5_00.true_text = local_340.true_text;
      args_5_00.mask = local_340.mask;
      args_5_00._1_7_ = local_340._1_7_;
      args_5_00.false_text = local_340.false_text;
      args_5_00.tooltip = local_340.tooltip;
      args_5_00.invert = local_340.invert;
      args_5_00._33_7_ = local_340._33_7_;
      args_6_00.true_text = local_368.true_text;
      args_6_00.mask = local_368.mask;
      args_6_00._1_7_ = local_368._1_7_;
      args_6_00.false_text = local_368.false_text;
      args_6_00.tooltip = local_368.tooltip;
      args_6_00.invert = local_368.invert;
      args_6_00._33_7_ = local_368._33_7_;
      args_7_00.true_text = local_390.true_text;
      args_7_00.mask = local_390.mask;
      args_7_00._1_7_ = local_390._1_7_;
      args_7_00.false_text = local_390.false_text;
      args_7_00.tooltip = local_390.tooltip;
      args_7_00.invert = local_390.invert;
      args_7_00._33_7_ = local_390._33_7_;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (pEVar1,0xff40,"LCDC",args_02,args_1_02,args_2_02,args_3_01,args_4_01,args_5_00,
                 args_6_00,args_7_00);
      pEVar1 = ((this->super_Window).d)->e;
      anon_unknown.dwarf_71760::Bit2(&local_3b8,'@',"Yi","Y compare interrupt");
      anon_unknown.dwarf_71760::Bit2(&local_3e0,' ',"2i","Mode 2 interrupt");
      anon_unknown.dwarf_71760::Bit2(&local_408,'\x10',"Vi","Vblank interrupt");
      anon_unknown.dwarf_71760::Bit2(&local_430,'\b',"Hi","Hblank interrupt");
      anon_unknown.dwarf_71760::Bit2(&local_458,'\x04',"Y=","Y compare set");
      local_468 = anon_unknown.dwarf_71760::Int("Mode",'\x03',0);
      args_03.true_text._0_4_ = (int)local_3b8.true_text;
      args_03.mask = local_3b8.mask;
      args_03._1_7_ = local_3b8._1_7_;
      args_03.true_text._4_4_ = (int)((ulong)local_3b8.true_text >> 0x20);
      args_03.false_text = local_3b8.false_text;
      args_03.tooltip._0_4_ = (int)local_3b8.tooltip;
      args_03.tooltip._4_4_ = (int)((ulong)local_3b8.tooltip >> 0x20);
      args_03.invert = local_3b8.invert;
      args_03._33_7_ = local_3b8._33_7_;
      args_1_03.true_text = local_3e0.true_text;
      args_1_03.mask = local_3e0.mask;
      args_1_03._1_7_ = local_3e0._1_7_;
      args_1_03.false_text = local_3e0.false_text;
      args_1_03.tooltip = local_3e0.tooltip;
      args_1_03.invert = local_3e0.invert;
      args_1_03._33_7_ = local_3e0._33_7_;
      args_2_03.true_text = local_408.true_text;
      args_2_03.mask = local_408.mask;
      args_2_03._1_7_ = local_408._1_7_;
      args_2_03.false_text = local_408.false_text;
      args_2_03.tooltip = local_408.tooltip;
      args_2_03.invert = local_408.invert;
      args_2_03._33_7_ = local_408._33_7_;
      args_3_02.true_text = local_430.true_text;
      args_3_02.mask = local_430.mask;
      args_3_02._1_7_ = local_430._1_7_;
      args_3_02.false_text = local_430.false_text;
      args_3_02.tooltip = local_430.tooltip;
      args_3_02.invert = local_430.invert;
      args_3_02._33_7_ = local_430._33_7_;
      args_4_02.true_text = local_458.true_text;
      args_4_02.mask = local_458.mask;
      args_4_02._1_7_ = local_458._1_7_;
      args_4_02.false_text = local_458.false_text;
      args_4_02.tooltip = local_458.tooltip;
      args_4_02.invert = local_458.invert;
      args_4_02._33_7_ = local_458._33_7_;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                (pEVar1,0xff41,"STAT",args_03,args_1_03,args_2_03,args_3_02,args_4_02,local_468);
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff42,"SCY");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff43,"SCX");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff44,"LY");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff45,"LYC");
      pEVar1 = ((this->super_Window).d)->e;
      local_470 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_BGP,0);
      local_478 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_BGP,1);
      local_480 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_BGP,2);
      local_488 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_BGP,3);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (pEVar1,0xff47,"BGP",local_470,local_478,local_480,local_488);
      pEVar1 = ((this->super_Window).d)->e;
      local_490 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP0,0);
      local_498 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP0,1);
      local_4a0 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP0,2);
      local_4a8 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP0,3);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (pEVar1,0xff48,"OPB0",local_490,local_498,local_4a0,local_4a8);
      pEVar1 = ((this->super_Window).d)->e;
      local_4b0 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP1,0);
      local_4b8 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP1,1);
      local_4c0 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP1,2);
      local_4c8 = anon_unknown.dwarf_71760::Swatch(PALETTE_TYPE_OBP1,3);
      DVar7 = local_4c0;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (pEVar1,0xff49,"OPB1",local_4b0,local_4b8,local_4c0,local_4c8);
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff4a,"WY");
      anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff4b,"WX");
      if ((((this->super_Window).d)->is_cgb & 1U) != 0) {
        pEVar1 = ((this->super_Window).d)->e;
        anon_unknown.dwarf_71760::Bit1(&local_4f0,0x80,"Sp","Current speed");
        anon_unknown.dwarf_71760::Bit1(&local_518,'\x01',"Sw","Speed switch");
        args_04.true_text._0_4_ = (int)local_4f0.true_text;
        args_04.mask = local_4f0.mask;
        args_04._1_7_ = local_4f0._1_7_;
        args_04.true_text._4_4_ = (int)((ulong)local_4f0.true_text >> 0x20);
        args_04.false_text = local_4f0.false_text;
        args_04.tooltip._0_4_ = (int)local_4f0.tooltip;
        args_04.tooltip._4_4_ = (int)((ulong)local_4f0.tooltip >> 0x20);
        args_04.invert = local_4f0.invert;
        args_04._33_7_ = local_4f0._33_7_;
        args_1_04.true_text = local_518.true_text;
        args_1_04.mask = local_518.mask;
        args_1_04._1_7_ = local_518._1_7_;
        args_1_04.false_text = local_518.false_text;
        args_1_04.tooltip = local_518.tooltip;
        args_1_04.invert = local_518.invert;
        args_1_04._33_7_ = local_518._33_7_;
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                  (pEVar1,0xff4d,"KEY1",args_04,args_1_04);
        pEVar1 = ((this->super_Window).d)->e;
        local_528 = (undefined1  [16])anon_unknown.dwarf_71760::Int("Bank",'\x01',0);
        args_08._8_8_ = DVar7;
        args_08.text = (char *)local_528._8_8_;
        anon_unknown.dwarf_71760::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_71760 *)pEVar1,(Emulator *)0xff4f,0x4eb8,
                   (char *)local_528._0_8_,args_08);
        pEVar1 = ((this->super_Window).d)->e;
        local_538 = anon_unknown.dwarf_71760::Int("Mode",0x80,7);
        local_548 = anon_unknown.dwarf_71760::Int("Blocks",'\x7f',0);
        pcVar8 = local_548.text;
        (anonymous_namespace)::TextReg<(anonymous_namespace)::IntArg,(anonymous_namespace)::IntArg>
                  (pEVar1,0xff55,"HDMA5",local_538,local_548);
        pEVar1 = ((this->super_Window).d)->e;
        local_558 = anon_unknown.dwarf_71760::Int("Enable",0xc0,6);
        anon_unknown.dwarf_71760::Bit1(&local_580,'\x02',"R","Read");
        anon_unknown.dwarf_71760::Bit1(&local_5a8,'\x01',"W","Write");
        args_1.true_text._0_4_ = (int)local_580.true_text;
        args_1.mask = local_580.mask;
        args_1._1_7_ = local_580._1_7_;
        args_1.true_text._4_4_ = (int)((ulong)local_580.true_text >> 0x20);
        args_1.false_text = local_580.false_text;
        args_1.tooltip._0_4_ = (int)local_580.tooltip;
        args_1.tooltip._4_4_ = (int)((ulong)local_580.tooltip >> 0x20);
        args_1.invert = local_580.invert;
        args_1._33_7_ = local_580._33_7_;
        args_2.true_text = local_5a8.true_text;
        args_2.mask = local_5a8.mask;
        args_2._1_7_ = local_5a8._1_7_;
        args_2.false_text = local_5a8.false_text;
        args_2.tooltip = local_5a8.tooltip;
        args_2.invert = local_5a8.invert;
        args_2._33_7_ = local_5a8._33_7_;
        (anonymous_namespace)::
        TextReg<(anonymous_namespace)::IntArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                  (pEVar1,0xff56,"RP",local_558,args_1,args_2);
        pEVar1 = ((this->super_Window).d)->e;
        anon_unknown.dwarf_71760::Bit1(&local_5d0,0x80,"+","Auto-increment");
        local_5e0 = anon_unknown.dwarf_71760::Int("Index",'?',0);
        args_05.true_text._0_4_ = (int)local_5d0.true_text;
        args_05.mask = local_5d0.mask;
        args_05._1_7_ = local_5d0._1_7_;
        args_05.true_text._4_4_ = (int)((ulong)local_5d0.true_text >> 0x20);
        args_05.false_text = local_5d0.false_text;
        args_05.tooltip._0_4_ = (int)local_5d0.tooltip;
        args_05.tooltip._4_4_ = (int)((ulong)local_5d0.tooltip >> 0x20);
        args_05.invert = local_5d0.invert;
        args_05._33_7_ = local_5d0._33_7_;
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (pEVar1,0xff68,"BCPS",args_05,local_5e0);
        anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff69,"BCPD");
        pEVar1 = ((this->super_Window).d)->e;
        anon_unknown.dwarf_71760::Bit1(&local_608,0x80,"+","Auto-increment");
        local_618 = anon_unknown.dwarf_71760::Int("Index",'?',0);
        args_06.true_text._0_4_ = (int)local_608.true_text;
        args_06.mask = local_608.mask;
        args_06._1_7_ = local_608._1_7_;
        args_06.true_text._4_4_ = (int)((ulong)local_608.true_text >> 0x20);
        args_06.false_text = local_608.false_text;
        args_06.tooltip._0_4_ = (int)local_608.tooltip;
        args_06.tooltip._4_4_ = (int)((ulong)local_608.tooltip >> 0x20);
        args_06.invert = local_608.invert;
        args_06._33_7_ = local_608._33_7_;
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (pEVar1,0xff6a,"OCPS",args_06,local_618);
        anon_unknown.dwarf_71760::TextReg<>(((this->super_Window).d)->e,0xff6b,"OCPD");
        pEVar1 = ((this->super_Window).d)->e;
        local_628 = (undefined1  [16])anon_unknown.dwarf_71760::Int("Bank",'\a',0);
        args_09._8_8_ = pcVar8;
        args_09.text = (char *)local_628._8_8_;
        anon_unknown.dwarf_71760::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_71760 *)pEVar1,(Emulator *)0xff70,0x4eb7,
                   (char *)local_628._0_8_,args_09);
      }
      pEVar1 = ((this->super_Window).d)->e;
      anon_unknown.dwarf_71760::Bit0(&local_650,'\x10',"JOYP ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_678,'\b',"SERIAL ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_6a0,'\x04',"TIMER ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_6c8,'\x02',"STAT ",(char *)0x0);
      anon_unknown.dwarf_71760::Bit0(&local_6f0,'\x01',"VBLANK ",(char *)0x0);
      args_07.true_text._0_4_ = (int)local_650.true_text;
      args_07.mask = local_650.mask;
      args_07._1_7_ = local_650._1_7_;
      args_07.true_text._4_4_ = (int)((ulong)local_650.true_text >> 0x20);
      args_07.false_text = local_650.false_text;
      args_07.tooltip._0_4_ = (int)local_650.tooltip;
      args_07.tooltip._4_4_ = (int)((ulong)local_650.tooltip >> 0x20);
      args_07.invert = local_650.invert;
      args_07._33_7_ = local_650._33_7_;
      args_1_05.true_text = local_678.true_text;
      args_1_05.mask = local_678.mask;
      args_1_05._1_7_ = local_678._1_7_;
      args_1_05.false_text = local_678.false_text;
      args_1_05.tooltip = local_678.tooltip;
      args_1_05.invert = local_678.invert;
      args_1_05._33_7_ = local_678._33_7_;
      args_2_04.true_text = local_6a0.true_text;
      args_2_04.mask = local_6a0.mask;
      args_2_04._1_7_ = local_6a0._1_7_;
      args_2_04.false_text = local_6a0.false_text;
      args_2_04.tooltip = local_6a0.tooltip;
      args_2_04.invert = local_6a0.invert;
      args_2_04._33_7_ = local_6a0._33_7_;
      args_3_03.true_text = local_6c8.true_text;
      args_3_03.mask = local_6c8.mask;
      args_3_03._1_7_ = local_6c8._1_7_;
      args_3_03.false_text = local_6c8.false_text;
      args_3_03.tooltip = local_6c8.tooltip;
      args_3_03.invert = local_6c8.invert;
      args_3_03._33_7_ = local_6c8._33_7_;
      args_4_03.true_text = local_6f0.true_text;
      args_4_03.mask = local_6f0.mask;
      args_4_03._1_7_ = local_6f0._1_7_;
      args_4_03.false_text = local_6f0.false_text;
      args_4_03.tooltip = local_6f0.tooltip;
      args_4_03.invert = local_6f0.invert;
      args_4_03._33_7_ = local_6f0._33_7_;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (pEVar1,0xffff,"IE",args_07,args_1_05,args_2_04,args_3_03,args_4_03);
      if ((((this->super_Window).d)->is_cgb & 1U) == 0) {
        if ((((this->super_Window).d)->is_sgb & 1U) != 0) {
          ImGui::NewLine();
          pEVar1 = ((this->super_Window).d)->e;
          SVar3 = anon_unknown.dwarf_71760::SgbSwatch(0,0);
          SVar4 = anon_unknown.dwarf_71760::SgbSwatch(0,1);
          SVar5 = anon_unknown.dwarf_71760::SgbSwatch(0,2);
          SVar6 = anon_unknown.dwarf_71760::SgbSwatch(0,3);
          (anonymous_namespace)::
          TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                    (pEVar1,"SGB Pal 0",SVar3,SVar4,SVar5,SVar6);
          pEVar1 = ((this->super_Window).d)->e;
          SVar3 = anon_unknown.dwarf_71760::SgbSwatch(1,0);
          SVar4 = anon_unknown.dwarf_71760::SgbSwatch(1,1);
          SVar5 = anon_unknown.dwarf_71760::SgbSwatch(1,2);
          SVar6 = anon_unknown.dwarf_71760::SgbSwatch(1,3);
          (anonymous_namespace)::
          TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                    (pEVar1,"SGB Pal 1",SVar3,SVar4,SVar5,SVar6);
          pEVar1 = ((this->super_Window).d)->e;
          SVar3 = anon_unknown.dwarf_71760::SgbSwatch(2,0);
          SVar4 = anon_unknown.dwarf_71760::SgbSwatch(2,1);
          SVar5 = anon_unknown.dwarf_71760::SgbSwatch(2,2);
          SVar6 = anon_unknown.dwarf_71760::SgbSwatch(2,3);
          (anonymous_namespace)::
          TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                    (pEVar1,"SGB Pal 2",SVar3,SVar4,SVar5,SVar6);
          pEVar1 = ((this->super_Window).d)->e;
          SVar3 = anon_unknown.dwarf_71760::SgbSwatch(3,0);
          SVar4 = anon_unknown.dwarf_71760::SgbSwatch(3,1);
          SVar5 = anon_unknown.dwarf_71760::SgbSwatch(3,2);
          SVar6 = anon_unknown.dwarf_71760::SgbSwatch(3,3);
          (anonymous_namespace)::
          TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                    (pEVar1,"SGB Pal 3",SVar3,SVar4,SVar5,SVar6);
        }
      }
      else {
        ImGui::NewLine();
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,0,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,0,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,0,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,0,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 0",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,1,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,1,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,1,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,1,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 1",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,2,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,2,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,2,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,2,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 2",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,3,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,3,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,3,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,3,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 3",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,4,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,4,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,4,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,4,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 4",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,5,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,5,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,5,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,5,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 5",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,6,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,6,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,6,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,6,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 6",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,7,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,7,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,7,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_BGCP,7,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB BG Pal 7",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,0,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,0,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,0,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,0,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 0",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,1,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,1,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,1,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,1,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 1",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,2,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,2,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,2,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,2,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 2",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,3,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,3,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,3,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,3,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 3",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,4,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,4,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,4,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,4,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 4",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,5,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,5,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,5,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,5,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 5",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,6,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,6,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,6,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,6,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 6",CVar9,CVar10,CVar11,CVar12);
        pEVar1 = ((this->super_Window).d)->e;
        CVar9 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,7,0);
        CVar10 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,7,1);
        CVar11 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,7,2);
        CVar12 = anon_unknown.dwarf_71760::CgbSwatch(CGB_PALETTE_TYPE_OBCP,7,3);
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (pEVar1,"CGB OBJ Pal 7",CVar9,CVar10,CVar11,CVar12);
      }
    }
    ImGui::End();
  }
  return;
}

Assistant:

void Debugger::IOWindow::Tick() {
  if (!is_open) return;

  if (ImGui::Begin(Debugger::s_io_window_name, &is_open)) {
    u8 v;
    TextReg(d->e, 0xff00, "JOYP", InvBit(0x18, "D"), InvBit(0x14, "U"),
            InvBit(0x12, "L"), InvBit(0x11, "R"), InvBit(0x28, "+"),
            InvBit(0x24, "-"), InvBit(0x22, "B"), InvBit(0x21, "A"));

    TextReg(d->e, 0xff01, "SB");
    TextReg(d->e, 0xff02, "SC");
    TextReg(d->e, 0xff04, "DIV");
    TextReg(d->e, 0xff05, "TIMA");
    TextReg(d->e, 0xff06, "TMA");
    TextReg(d->e, 0xff07, "TAC", Bit(0x4, "on", "off"), Enum<TimerClock>(0x3));

    TextReg(d->e, 0xff0f, "IF", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    TextReg(d->e, 0xff40, "LCDC", Bit2(0x80, "D ", "Display"),
            Bit2(0x40, "WM", "Window tile map select"),
            Bit2(0x20, "Wd", "Window display"),
            Bit2(0x10, "BD", "BG tile data select"),
            Bit2(0x08, "BM", "BG tile map select"),
            Bit2(0x04, "Os", "Obj size"), Bit2(0x02, "Od", "Obj display"),
            Bit2(0x01, "Bd", "BG display"));

    TextReg(d->e, 0xff41, "STAT", Bit2(0x40, "Yi", "Y compare interrupt"),
            Bit2(0x20, "2i", "Mode 2 interrupt"),
            Bit2(0x10, "Vi", "Vblank interrupt"),
            Bit2(0x08, "Hi", "Hblank interrupt"),
            Bit2(0x04, "Y=", "Y compare set"), Int("Mode", 0x03));

    TextReg(d->e, 0xff42, "SCY");
    TextReg(d->e, 0xff43, "SCX");
    TextReg(d->e, 0xff44, "LY");
    TextReg(d->e, 0xff45, "LYC");
    TextReg(d->e, 0xff47, "BGP", Swatch(PALETTE_TYPE_BGP, 0),
            Swatch(PALETTE_TYPE_BGP, 1), Swatch(PALETTE_TYPE_BGP, 2),
            Swatch(PALETTE_TYPE_BGP, 3));
    TextReg(d->e, 0xff48, "OPB0", Swatch(PALETTE_TYPE_OBP0, 0),
            Swatch(PALETTE_TYPE_OBP0, 1), Swatch(PALETTE_TYPE_OBP0, 2),
            Swatch(PALETTE_TYPE_OBP0, 3));
    TextReg(d->e, 0xff49, "OPB1", Swatch(PALETTE_TYPE_OBP1, 0),
            Swatch(PALETTE_TYPE_OBP1, 1), Swatch(PALETTE_TYPE_OBP1, 2),
            Swatch(PALETTE_TYPE_OBP1, 3));
    TextReg(d->e, 0xff4A, "WY");
    TextReg(d->e, 0xff4B, "WX");

    if (d->is_cgb) {
      TextReg(d->e, 0xff4d, "KEY1", Bit1(0x80, "Sp", "Current speed"),
              Bit1(0x1, "Sw", "Speed switch"));
      TextReg(d->e, 0xff4f, "VBK", Int("Bank", 0x1));
      TextReg(d->e, 0xff55, "HDMA5", Int("Mode", 0x80, 7), Int("Blocks", 0x7f));
      TextReg(d->e, 0xff56, "RP", Int("Enable", 0xc0, 6),
              Bit1(0x2, "R", "Read"), Bit1(0x01, "W", "Write"));

      TextReg(d->e, 0xff68, "BCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff69, "BCPD");
      TextReg(d->e, 0xff6a, "OCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff6b, "OCPD");
      TextReg(d->e, 0xff70, "SVBK", Int("Bank", 0x7));
    }

    TextReg(d->e, 0xffff, "IE", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    if (d->is_cgb) {
      ImGui::NewLine();
      TextCgbPal(d->e, "CGB BG Pal 0", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 3));
      TextCgbPal(d->e, "CGB BG Pal 1", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 3));
      TextCgbPal(d->e, "CGB BG Pal 2", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 3));
      TextCgbPal(d->e, "CGB BG Pal 3", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 3));
      TextCgbPal(d->e, "CGB BG Pal 4", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 3));
      TextCgbPal(d->e, "CGB BG Pal 5", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 3));
      TextCgbPal(d->e, "CGB BG Pal 6", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 3));
      TextCgbPal(d->e, "CGB BG Pal 7", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 0", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 1", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 2", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 3", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 4", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 5", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 6", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 7", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 3));
    } else if (d->is_sgb) {
      ImGui::NewLine();
      TextSgbPal(d->e, "SGB Pal 0", SgbSwatch(0, 0), SgbSwatch(0, 1),
                 SgbSwatch(0, 2), SgbSwatch(0, 3));
      TextSgbPal(d->e, "SGB Pal 1", SgbSwatch(1, 0), SgbSwatch(1, 1),
                 SgbSwatch(1, 2), SgbSwatch(1, 3));
      TextSgbPal(d->e, "SGB Pal 2", SgbSwatch(2, 0), SgbSwatch(2, 1),
                 SgbSwatch(2, 2), SgbSwatch(2, 3));
      TextSgbPal(d->e, "SGB Pal 3", SgbSwatch(3, 0), SgbSwatch(3, 1),
                 SgbSwatch(3, 2), SgbSwatch(3, 3));
    }
  }
  ImGui::End();
}